

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O0

int GetBBUserSeanet(SEANET *pSeanet)

{
  int iVar1;
  double dVar2;
  undefined1 local_188 [8];
  CHRONO chrono;
  uchar local_138 [4];
  int nbdatabytes;
  uchar databuf [264];
  uint8 local_26 [8];
  uchar reqbuf [14];
  SEANET *pSeanet_local;
  
  builtin_memcpy(local_26,"@0008\b",7);
  local_26[7] = 0xff;
  reqbuf[0] = '\x02';
  reqbuf[1] = '\x03';
  reqbuf[2] = '\x18';
  reqbuf[3] = 0x80;
  reqbuf[4] = '\x02';
  reqbuf[5] = '\n';
  chrono._68_4_ = 0;
  reqbuf._6_8_ = pSeanet;
  iVar1 = WriteAllRS232Port(&pSeanet->RS232Port,local_26,0xe);
  if (iVar1 == 0) {
    memset(local_138,0,0x108);
    chrono._68_4_ = 0;
    iVar1 = GetMsgSeanet((SEANET *)reqbuf._6_8_,6,local_138,0x108,(int *)&chrono.field_0x44);
    if (iVar1 == 0) {
      if (databuf[0xb] == '\x0f') {
        *(undefined4 *)(reqbuf._6_8_ + 0x318) = 1;
        if (databuf[0x8a] == '\x01') {
          *(undefined4 *)(reqbuf._6_8_ + 0x31c) = 1;
        }
        else {
          *(undefined4 *)(reqbuf._6_8_ + 0x31c) = 0;
        }
        memset(local_138,0,0x108);
        chrono._68_4_ = 0;
        iVar1 = GetMsgSeanet((SEANET *)reqbuf._6_8_,0x3f,local_138,0x108,(int *)&chrono.field_0x44);
        if (iVar1 != 0) {
          printf("A Seanet is not responding correctly. \n");
          return 1;
        }
        memset(local_138,0,0x108);
        chrono._68_4_ = 0;
        iVar1 = GetMsgSeanet((SEANET *)reqbuf._6_8_,0x39,local_138,0x108,(int *)&chrono.field_0x44);
        if (iVar1 != 0) {
          printf("A Seanet is not responding correctly. \n");
          return 1;
        }
      }
      else {
        *(undefined4 *)(reqbuf._6_8_ + 0x318) = 0;
        if (databuf[0x5b] == '\x01') {
          *(undefined4 *)(reqbuf._6_8_ + 0x31c) = 1;
        }
        else {
          *(undefined4 *)(reqbuf._6_8_ + 0x31c) = 0;
        }
      }
      StartChrono((CHRONO *)local_188);
      do {
        dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_188);
        if (10.0 < dVar2) {
          printf("Error reading data from a Seanet : BBUser timeout. \n");
          return 2;
        }
        memset(local_138,0,0x108);
        chrono._68_4_ = 0;
        iVar1 = GetLatestMsgSeanet((SEANET *)reqbuf._6_8_,4,local_138,0x108,
                                   (int *)&chrono.field_0x44);
        if (iVar1 != 0) {
          printf("A Seanet is not responding correctly. \n");
          return 1;
        }
        *(uint *)(reqbuf._6_8_ + 0x380) = (uint)databuf[0xc];
      } while ((databuf[0xc] & 0x40) == 0 || (databuf[0xc] & 0x80) == 0);
      pSeanet_local._4_4_ = 0;
    }
    else {
      printf("A Seanet is not responding correctly. \n");
      pSeanet_local._4_4_ = 1;
    }
  }
  else {
    printf("Error writing data to a Seanet. \n");
    pSeanet_local._4_4_ = 1;
  }
  return pSeanet_local._4_4_;
}

Assistant:

inline int GetBBUserSeanet(SEANET* pSeanet)
{
	unsigned char reqbuf[] = {MESSAGE_HEADER_SEANET,'0','0','0','8',0x08,0x00,
		SERIAL_PORT_PROGRAM_NODE_NUMBER_SEANET,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,
		0x03,mtSendBBUser,0x80,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,MESSAGE_TERMINATOR_SEANET};
	unsigned char databuf[264];
	int nbdatabytes = 0;
	CHRONO chrono;

	// Send mtSendBBUser message.
	if (WriteAllRS232Port(&pSeanet->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a Seanet. \n");
		return EXIT_FAILURE;
	}

	// Wait for a mtBBUserData message.
	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	//if (GetLatestMsgSeanet(pSeanet, mtBBUserData, databuf, sizeof(databuf), &nbdatabytes)
	//	!= EXIT_SUCCESS)
	if (GetMsgSeanet(pSeanet, mtBBUserData, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		printf("A Seanet is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	if (databuf[19] == 15) 
	{
		pSeanet->bDST = TRUE;
		if (databuf[146] == 1) pSeanet->bHalfDuplex = TRUE; else pSeanet->bHalfDuplex = FALSE;

		// There is a risk here that mtFpgaCalibrationData and mtFpgaVersionData go as unexpected data 
		// for the mtBBUserData if the computer is too slow...
		// Should just wait for mtAlive message (instead of mtFpgaCalibrationData and mtFpgaVersionData) 
		// to be sure? Or should use GetMsgSeanet()?

		// mtFpgaCalibrationData and mtFpgaVersionData messages should follow the mtBBuserData reply.
		memset(databuf, 0, sizeof(databuf));
		nbdatabytes = 0;
		//if (GetLatestMsgSeanet(pSeanet, mtFpgaCalibrationData, databuf, sizeof(databuf), &nbdatabytes)
		//	!= EXIT_SUCCESS)
		if (GetMsgSeanet(pSeanet, mtFpgaCalibrationData, databuf, sizeof(databuf), &nbdatabytes)
			!= EXIT_SUCCESS)
		{ 
			printf("A Seanet is not responding correctly. \n");
			return EXIT_FAILURE;	
		}
		memset(databuf, 0, sizeof(databuf));
		nbdatabytes = 0;
		//if (GetLatestMsgSeanet(pSeanet, mtFpgaVersionData, databuf, sizeof(databuf), &nbdatabytes)
		//	!= EXIT_SUCCESS)
		if (GetMsgSeanet(pSeanet, mtFpgaVersionData, databuf, sizeof(databuf), &nbdatabytes)
			!= EXIT_SUCCESS)
		{ 
			printf("A Seanet is not responding correctly. \n");
			return EXIT_FAILURE;	
		}
	}
	else
	{
		pSeanet->bDST = FALSE;
		if (databuf[99] == 1) pSeanet->bHalfDuplex = TRUE; else pSeanet->bHalfDuplex = FALSE;
	}

	StartChrono(&chrono);

	// Check mtAlive message HeadInf byte with NoParams (bit 6=1), SentCfg (bit 7=1).
	do
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_BBUSER_SEANET)
		{
			printf("Error reading data from a Seanet : BBUser timeout. \n");
			return EXIT_TIMEOUT;
		}

		// Wait for a mtAlive message. It should come every 1 second.
		memset(databuf, 0, sizeof(databuf));
		nbdatabytes = 0;
		if (GetLatestMsgSeanet(pSeanet, mtAlive, databuf, sizeof(databuf), &nbdatabytes)
			!= EXIT_SUCCESS)
		{ 
			printf("A Seanet is not responding correctly. \n");
			return EXIT_FAILURE;	
		}

		// HeadInf.
		pSeanet->HeadInf = (unsigned char)databuf[20];

		//printf("mtAlive message databuf[20]=%#x\n", (int)databuf[20]);
	}
	while (!(databuf[20]&0x40)||!(databuf[20]&0x80));

	return EXIT_SUCCESS;
}